

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btBoxBoxCollisionAlgorithm::btBoxBoxCollisionAlgorithm
          (btBoxBoxCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap)

{
  btDispatcher *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (&this->super_btActivatingCollisionAlgorithm,ci,body0Wrap,body1Wrap);
  (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm._vptr_btCollisionAlgorithm
       = (_func_int **)&PTR__btBoxBoxCollisionAlgorithm_001ec7b0;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  if (mf == (btPersistentManifold *)0x0) {
    pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pbVar1->_vptr_btDispatcher[6])
                      (pbVar1,body0Wrap->m_collisionObject,body1Wrap->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
      iVar2 = (*pbVar1->_vptr_btDispatcher[3])
                        (pbVar1,body0Wrap->m_collisionObject,body1Wrap->m_collisionObject);
      this->m_manifoldPtr = (btPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

btBoxBoxCollisionAlgorithm::btBoxBoxCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
: btActivatingCollisionAlgorithm(ci,body0Wrap,body1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf)
{
	if (!m_manifoldPtr && m_dispatcher->needsCollision(body0Wrap->getCollisionObject(),body1Wrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(body0Wrap->getCollisionObject(),body1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}